

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  uint uVar1;
  uint64 uVar2;
  uint64 uVar3;
  bool bVar4;
  short sVar5;
  bool bVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float *pfVar16;
  uint *puVar17;
  uint *puVar18;
  byte *pbVar19;
  color_quad<unsigned_char,_int> *this_00;
  long local_2f8;
  color_quad<unsigned_char,_int> *local_2a8;
  ushort local_2a0;
  ushort local_294;
  uint local_240;
  ushort local_238;
  uint local_214;
  ushort local_20c;
  uint local_1bc;
  long lStack_1b8;
  uint c_1;
  uint64 d [3];
  ulong local_198;
  uint64 s_1;
  uint64 error;
  color_quad_u8 block_colors [4];
  uint local_170;
  uint16 H_1;
  uint16 L_1;
  uint i_1;
  ushort local_164;
  uint16 H;
  uint16 r_1;
  uint16 g_1;
  uint16 b_1;
  uint16 r0_1;
  uint16 g0_1;
  uint16 b0_1;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  uint16 L;
  uint16 r;
  uint16 g;
  uint16 b;
  uint16 r0;
  uint16 g0;
  uint16 b0;
  uint solutions_count;
  uint iterations;
  bool improved;
  bool preserveL;
  vector<unsigned_int> solutions;
  uint c;
  uint8 s;
  color_quad_u8 *pixel;
  uint i;
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  uint64 hist [4];
  uint16 H0;
  uint16 L0;
  vec3F *high_color_local;
  vec3F *low_color_local;
  dxt_endpoint_refiner *this_local;
  
  pfVar16 = vec<3U,_float>::operator[](low_color,0);
  iVar13 = math::clamp<int>((int)(*pfVar16 * 32.0),0,0x1f);
  pfVar16 = vec<3U,_float>::operator[](low_color,1);
  iVar14 = math::clamp<int>((int)(*pfVar16 * 64.0),0,0x3f);
  pfVar16 = vec<3U,_float>::operator[](low_color,2);
  iVar15 = math::clamp<int>((int)(*pfVar16 * 32.0),0,0x1f);
  hist[3]._6_2_ = (ushort)(iVar13 << 0xb) | (ushort)(iVar14 << 5) | (ushort)iVar15;
  pfVar16 = vec<3U,_float>::operator[](high_color,0);
  iVar13 = math::clamp<int>((int)(*pfVar16 * 32.0),0,0x1f);
  pfVar16 = vec<3U,_float>::operator[](high_color,1);
  iVar14 = math::clamp<int>((int)(*pfVar16 * 64.0),0,0x3f);
  pfVar16 = vec<3U,_float>::operator[](high_color,2);
  iVar15 = math::clamp<int>((int)(*pfVar16 * 32.0),0,0x1f);
  hist[3]._4_2_ = (ushort)(iVar13 << 0xb) | (ushort)(iVar14 << 5) | (ushort)iVar15;
  memset(D2[3] + 2,0,0x20);
  memset(DD[3] + 2,0,0x60);
  memset(&stack0xfffffffffffffef8,0,0x60);
  for (pixel._4_4_ = 0; pixel._4_4_ < this->m_pParams->m_num_pixels; pixel._4_4_ = pixel._4_4_ + 1)
  {
    this_00 = this->m_pParams->m_pPixels + pixel._4_4_;
    solutions.m_capacity._3_1_ = this->m_pParams->m_pSelectors[pixel._4_4_];
    hist[(ulong)solutions.m_capacity._3_1_ - 1] = hist[(ulong)solutions.m_capacity._3_1_ - 1] + 1;
    for (solutions.m_size = 0; solutions.m_size < 3; solutions.m_size = solutions.m_size + 1) {
      bVar8 = color_quad<unsigned_char,_int>::operator[](this_00,solutions.m_size);
      DD[(ulong)solutions.m_capacity._3_1_ + 3][(ulong)solutions.m_size + 2] =
           (long)(int)((uint)bVar8 << 1) +
           DD[(ulong)solutions.m_capacity._3_1_ + 3][(ulong)solutions.m_size + 2];
      bVar8 = color_quad<unsigned_char,_int>::operator[](this_00,solutions.m_size);
      bVar9 = color_quad<unsigned_char,_int>::operator[](this_00,solutions.m_size);
      lVar7 = (ulong)solutions.m_capacity._3_1_ * 0x18 + -0x108;
      *(long *)(&stack0xfffffffffffffef8 + (ulong)solutions.m_size * 8 + lVar7 + 0x108) =
           (long)(int)((uint)bVar8 * (uint)bVar9) +
           *(long *)(&stack0xfffffffffffffef8 + (ulong)solutions.m_size * 8 + lVar7 + 0x108);
    }
  }
  vector<unsigned_int>::vector((vector<unsigned_int> *)&iterations,0x36);
  bVar4 = hist[0] + hist[2] < D2[3][2] + hist[1];
  bVar6 = true;
  for (_g0 = 8; bVar6 && _g0 != 0; _g0 = _g0 + -1) {
    bVar6 = false;
    _b = 0;
    uVar10 = hist[3]._6_2_ & 0x1f;
    uVar11 = (ushort)((int)(uint)hist[3]._6_2_ >> 5) & 0x3f;
    sVar5 = (short)((int)(uint)hist[3]._6_2_ >> 0xb);
    if (uVar10 == 0) {
      local_144 = 0;
    }
    else {
      local_144 = uVar10 - 1;
    }
    for (; local_144 <= (ushort)(uVar10 + 1) && local_144 < 0x20; local_144 = local_144 + 1) {
      local_146 = uVar11;
      if (((int)(uint)hist[3]._6_2_ >> 5 & 0x3fU) != 0) {
        local_146 = uVar11 - 1;
      }
      for (; local_146 <= (ushort)(uVar11 + 1) && local_146 < 0x40; local_146 = local_146 + 1) {
        if (sVar5 == 0) {
          local_20c = 0;
        }
        else {
          local_20c = sVar5 - 1;
        }
        for (local_148 = local_20c;
            (uint)local_148 <= ((int)(uint)hist[3]._6_2_ >> 0xb) + 1U && local_148 < 0x20;
            local_148 = local_148 + 1) {
          uVar12 = local_148 << 0xb | local_146 << 5 | local_144;
          if (uVar12 != hist[3]._6_2_) {
            if (hist[3]._4_2_ < uVar12) {
              local_214 = CONCAT22(hist[3]._4_2_,uVar12);
            }
            else {
              local_214 = CONCAT22(uVar12,hist[3]._4_2_);
            }
            puVar17 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&iterations,_b);
            *puVar17 = local_214;
            _b = _b + 1;
          }
        }
      }
    }
    uVar10 = hist[3]._4_2_ & 0x1f;
    uVar11 = (ushort)((int)(uint)hist[3]._4_2_ >> 5) & 0x3f;
    sVar5 = (short)((int)(uint)hist[3]._4_2_ >> 0xb);
    if (uVar10 == 0) {
      local_164 = 0;
    }
    else {
      local_164 = uVar10 - 1;
    }
    for (; local_164 <= (ushort)(uVar10 + 1) && local_164 < 0x20; local_164 = local_164 + 1) {
      i_1._2_2_ = uVar11;
      if (((int)(uint)hist[3]._4_2_ >> 5 & 0x3fU) != 0) {
        i_1._2_2_ = uVar11 - 1;
      }
      for (; i_1._2_2_ <= (ushort)(uVar11 + 1) && i_1._2_2_ < 0x40; i_1._2_2_ = i_1._2_2_ + 1) {
        if (sVar5 == 0) {
          local_238 = 0;
        }
        else {
          local_238 = sVar5 - 1;
        }
        for (i_1._0_2_ = local_238;
            (uint)(ushort)i_1 <= ((int)(uint)hist[3]._4_2_ >> 0xb) + 1U && (ushort)i_1 < 0x20;
            i_1._0_2_ = (ushort)i_1 + 1) {
          uVar12 = (ushort)i_1 << 0xb | i_1._2_2_ << 5 | local_164;
          if (uVar12 != hist[3]._4_2_) {
            if (hist[3]._6_2_ < uVar12) {
              local_240 = CONCAT22(hist[3]._6_2_,uVar12);
            }
            else {
              local_240 = CONCAT22(uVar12,hist[3]._6_2_);
            }
            puVar17 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&iterations,_b);
            *puVar17 = local_240;
            _b = _b + 1;
          }
        }
      }
    }
    puVar17 = vector<unsigned_int>::begin((vector<unsigned_int> *)&iterations);
    puVar18 = vector<unsigned_int>::begin((vector<unsigned_int> *)&iterations);
    std::sort<unsigned_int*>(puVar17,puVar18 + _b);
    for (local_170 = 0; local_170 < _b; local_170 = local_170 + 1) {
      if (local_170 == 0) {
LAB_00221c6c:
        puVar17 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&iterations,local_170);
        block_colors[3].field_0._2_2_ = (undefined2)*puVar17;
        puVar17 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&iterations,local_170);
        uVar1 = *puVar17;
        block_colors[3].field_0._0_2_ = (undefined2)(uVar1 >> 0x10);
        if (block_colors[3].field_0.m_u32._2_2_ == block_colors[3].field_0._0_2_) {
          if (bVar4) {
            local_294 = (ushort)(block_colors[3].field_0.m_u32._2_2_ == 0);
          }
          else if (((block_colors[3].field_0.m_u32._2_2_ ^ 0xffff) & 0x1f) == 0) {
            if (((block_colors[3].field_0.m_u32._2_2_ ^ 0xffff) & 0xf800) == 0) {
              local_294 = 0;
              if (((block_colors[3].field_0.m_u32._2_2_ ^ 0xffff) & 0x7e0) != 0) {
                local_294 = 0x20;
              }
            }
            else {
              local_294 = 0x800;
            }
          }
          else {
            local_294 = 1;
          }
          block_colors[3].field_0._2_2_ = block_colors[3].field_0.m_u32._2_2_ + local_294;
          if (bVar4) {
            if ((uVar1 & 0x1f0000) == 0) {
              if ((uVar1 & 0xf8000000) == 0) {
                local_2a0 = 0;
                if ((uVar1 & 0x7e00000) != 0) {
                  local_2a0 = 0x20;
                }
              }
              else {
                local_2a0 = 0x800;
              }
            }
            else {
              local_2a0 = 1;
            }
          }
          else {
            local_2a0 = (ushort)(block_colors[3].field_0._0_2_ == -1);
          }
          block_colors[3].field_0._0_2_ = block_colors[3].field_0._0_2_ - local_2a0;
        }
        local_2a8 = (color_quad<unsigned_char,_int> *)&error;
        do {
          color_quad<unsigned_char,_int>::color_quad(local_2a8);
          local_2a8 = local_2a8 + 1;
        } while (local_2a8 != block_colors + 2);
        dxt1_block::get_block_colors4
                  ((color_quad_u8 *)&error,block_colors[3].field_0.m_u32._2_2_,
                   (undefined2)block_colors[3].field_0.m_u32);
        s_1 = 0;
        for (local_198 = 0; local_198 < 4; local_198 = local_198 + 1) {
          for (local_1bc = 0; local_1bc < 3; local_1bc = local_1bc + 1) {
            uVar2 = hist[local_198 - 1];
            pbVar19 = color_quad<unsigned_char,_int>::operator[]
                                (block_colors + (local_198 - 2),local_1bc);
            bVar8 = *pbVar19;
            pbVar19 = color_quad<unsigned_char,_int>::operator[]
                                (block_colors + (local_198 - 2),local_1bc);
            bVar9 = *pbVar19;
            uVar3 = DD[local_198 + 3][(ulong)local_1bc + 2];
            pbVar19 = color_quad<unsigned_char,_int>::operator[]
                                (block_colors + (local_198 - 2),local_1bc);
            *(uint64 *)((long)&stack0xfffffffffffffe48 + (ulong)local_1bc * 8) =
                 (uVar2 * bVar8 * (ulong)bVar9 - uVar3 * *pbVar19) +
                 *(long *)(&stack0xfffffffffffffef8 + (ulong)local_1bc * 8 + local_198 * 0x18);
          }
          if ((this->m_pParams->m_perceptual & 1U) == 0) {
            local_2f8 = lStack_1b8 + d[0];
          }
          else {
            local_2f8 = lStack_1b8 * 8 + d[0] * 0x19;
          }
          local_2f8 = local_2f8 + d[1];
          s_1 = local_2f8 + s_1;
        }
        if (s_1 < this->m_pResults->m_error) {
          hist[3]._6_2_ = block_colors[3].field_0.m_u32._2_2_;
          this->m_pResults->m_low_color = block_colors[3].field_0.m_u32._2_2_;
          hist[3]._4_2_ = (undefined2)block_colors[3].field_0.m_u32;
          this->m_pResults->m_high_color = (undefined2)block_colors[3].field_0.m_u32;
          this->m_pResults->m_error = s_1;
          if (this->m_pResults->m_error == 0) goto LAB_00222137;
          bVar6 = true;
        }
      }
      else {
        puVar17 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&iterations,local_170);
        uVar1 = *puVar17;
        puVar17 = vector<unsigned_int>::operator[]
                            ((vector<unsigned_int> *)&iterations,local_170 - 1);
        if (uVar1 != *puVar17) goto LAB_00221c6c;
      }
    }
  }
LAB_00222137:
  vector<unsigned_int>::~vector((vector<unsigned_int> *)&iterations);
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color)
    {
        uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
        uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

        uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            const color_quad_u8& pixel = m_pParams->m_pPixels[i];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            for (uint c = 0; c < 3; c++)
            {
                D2[s][c] += pixel[c] * 2;
                DD[s][c] += pixel[c] * pixel[c];
            }
        }
        crnlib::vector<uint> solutions(54);
        bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
        bool improved = true;

        for (uint iterations = 8; improved && iterations; iterations--)
        {
            improved = false;
            uint solutions_count = 0;
            for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 L = r << 11 | g << 5 | b;
                        if (L != L0)
                        {
                            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
                        }
                    }
                }
            }
            for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 H = r << 11 | g << 5 | b;
                        if (H != H0)
                        {
                            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
                        }
                    }
                }
            }
            std::sort(solutions.begin(), solutions.begin() + solutions_count);
            for (uint i = 0; i < solutions_count; i++)
            {
                if (i && solutions[i] == solutions[i - 1])
                {
                    continue;
                }
                uint16 L = solutions[i] & 0xFFFF;
                uint16 H = solutions[i] >> 16;
                if (L == H)
                {
                    L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800
                            : ~L & 0x7E0                            ? 0x20
                                                                    : 0
                        : !L        ? 0x1
                                    : 0;
                    H -= preserveL    ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800
                               : H & 0x7E0                          ? 0x20
                                                                    : 0
                        : H == 0xFFFF ? 0x1
                                      : 0;
                }
                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors4(block_colors, L, H);
                uint64 error = 0;
                for (uint64 s = 0, d[3]; s < 4; s++)
                {
                    for (uint c = 0; c < 3; c++)
                    {
                        d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
                    }
                    error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
                }
                if (error < m_pResults->m_error)
                {
                    m_pResults->m_low_color = L0 = L;
                    m_pResults->m_high_color = H0 = H;
                    m_pResults->m_error = error;
                    if (!m_pResults->m_error)
                    {
                        return;
                    }
                    improved = true;
                }
            }
        }
    }